

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

void trad_enc_decrypt_update
               (trad_enc_ctx *ctx,uint8_t *in,size_t in_len,uint8_t *out,size_t out_len)

{
  uint uVar1;
  byte c;
  ulong uVar2;
  
  if (in_len < out_len) {
    out_len = in_len;
  }
  for (uVar2 = 0; (out_len & 0xffffffff) != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = ctx->keys[2] | 2;
    c = (byte)((uVar1 ^ 1) * uVar1 >> 8) ^ in[uVar2];
    out[uVar2] = c;
    trad_enc_update_keys(ctx,c);
  }
  return;
}

Assistant:

static void
trad_enc_decrypt_update(struct trad_enc_ctx *ctx, const uint8_t *in,
    size_t in_len, uint8_t *out, size_t out_len)
{
	unsigned i, max;

	max = (unsigned)((in_len < out_len)? in_len: out_len);

	for (i = 0; i < max; i++) {
		uint8_t t = in[i] ^ trad_enc_decypt_byte(ctx);
		out[i] = t;
		trad_enc_update_keys(ctx, t);
	}
}